

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::update_scrape_state(torrent *this)

{
  header_holder_type *phVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  announce_entry *t;
  node_ptr plVar5;
  uint uVar6;
  node_ptr plVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  
  phVar1 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header;
  plVar5 = (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.next_;
  if (plVar5 == &phVar1->super_node) {
    uVar6 = 0xffffffff;
    uVar10 = 0xffffffff;
    uVar11 = 0xffffffff;
  }
  else {
    uVar11 = 0xffffffff;
    uVar10 = 0xffffffff;
    uVar6 = 0xffffffff;
    do {
      for (plVar7 = plVar5[5].next_; plVar7 != plVar5[5].prev_;
          plVar7 = (node_ptr)&plVar7[0xc].prev_) {
        lVar8 = 0;
        do {
          uVar9 = (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar8];
          uVar3 = *(uint *)((long)plVar7 + uVar9 * 0x48 + 0x58);
          uVar4 = *(uint *)((long)plVar7 + uVar9 * 0x48 + 0x5c);
          if ((int)uVar11 < (int)uVar4) {
            uVar11 = uVar4;
          }
          if ((int)uVar10 < (int)uVar3) {
            uVar10 = uVar3;
          }
          uVar3 = *(uint *)((long)plVar7 + uVar9 * 0x48 + 0x60);
          if ((int)uVar6 < (int)uVar3) {
            uVar6 = uVar3;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 2);
      }
      plVar5 = plVar5->next_;
    } while (plVar5 != &phVar1->super_node);
  }
  if ((((-1 < (int)uVar11) &&
       ((*(uint *)&(this->super_torrent_hot_members).field_0x48 & 0xffffff) != uVar11)) ||
      ((-1 < (int)uVar10 && ((*(uint *)&this->field_0x5dd & 0xffffff) != uVar10)))) ||
     ((-1 < (int)uVar6 && ((*(uint *)&this->field_0x600 >> 7 & 0xffffff) != uVar6)))) {
    state_updated(this);
  }
  uVar9 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if (((((uint)uVar9 & 0xffffff) != uVar11) || ((*(uint *)&this->field_0x5dd & 0xffffff) != uVar10))
     || ((*(uint *)&this->field_0x600 >> 7 & 0xffffff) != uVar6)) {
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         uVar9 & 0xffffffffff000000 | (ulong)(uVar11 & 0xffffff);
    *(uint *)&this->field_0x5dd = uVar10 & 0xffffff | (uint)(byte)this->field_0x5e0 << 0x18;
    *(uint *)&this->field_0x600 = *(uint *)&this->field_0x600 & 0x8000007f | (uVar6 & 0xffffff) << 7
    ;
    update_auto_sequential(this);
    bVar2 = (this->m_need_save_resume_data).m_val;
    if ((bVar2 & 8) == 0) {
      (this->m_need_save_resume_data).m_val = bVar2 | 8;
      state_updated(this);
      return;
    }
  }
  return;
}

Assistant:

void torrent::update_scrape_state()
	{
		// loop over all trackers and find the largest numbers for each scrape field
		// then update the torrent-wide understanding of number of downloaders and seeds
		int complete = -1;
		int incomplete = -1;
		int downloaded = -1;
		for (auto const& t : m_trackers)
		{
			for (auto const& aep : t.endpoints)
			{
				for (protocol_version const ih : all_versions)
				{
					auto const& a = aep.info_hashes[ih];
					complete = std::max(a.scrape_complete, complete);
					incomplete = std::max(a.scrape_incomplete, incomplete);
					downloaded = std::max(a.scrape_downloaded, downloaded);
				}
			}
		}

		if ((complete >= 0 && int(m_complete) != complete)
			|| (incomplete >= 0 && int(m_incomplete) != incomplete)
			|| (downloaded >= 0 && int(m_downloaded) != downloaded))
			state_updated();

		if (int(m_complete) != complete
			|| int(m_incomplete) != incomplete
			|| int(m_downloaded) != downloaded)
		{
			m_complete = std::uint32_t(complete);
			m_incomplete = std::uint32_t(incomplete);
			m_downloaded = std::uint32_t(downloaded);

			update_auto_sequential();

			// these numbers are cached in the resume data
			set_need_save_resume(torrent_handle::if_counters_changed);
		}
	}